

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  undefined1 uVar2;
  bool bVar3;
  long in_RSI;
  int *in_RDI;
  string *unaff_retaddr;
  int j;
  bool remove_flag;
  char *arg;
  string arg_string;
  int i;
  string flagfile_value;
  char *in_stack_000000d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  int in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  wchar_t **in_stack_ffffffffffffffa8;
  int local_34;
  string local_30 [16];
  char *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(local_30);
  for (local_34 = 1; local_34 < *in_RDI; local_34 = local_34 + 1) {
    StreamableToString<wchar_t*>(in_stack_ffffffffffffffa8);
    std::__cxx11::string::c_str();
    in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c & 0xffffff;
    uVar2 = ParseGoogleTestFlag(in_stack_000000d8);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff8c = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
    }
    else {
      in_stack_ffffffffffffff86 =
           ParseFlag<std::__cxx11::string>
                     ((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      (char *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff86,
                                                      in_stack_ffffffffffffff80)),
                      in_stack_ffffffffffffff78);
      if ((bool)in_stack_ffffffffffffff86) {
        std::__cxx11::string::operator=((string *)FLAGS_gtest_flagfile_abi_cxx11_,local_30);
        LoadFlagsFromFile(unaff_retaddr);
        in_stack_ffffffffffffff8c = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff86,
                                                         in_stack_ffffffffffffff80)),
                                (char *)in_stack_ffffffffffffff78);
        if ((bVar3) ||
           (bVar3 = HasGoogleTestFlagPrefix
                              ((char *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff86,
                                                               in_stack_ffffffffffffff80))), bVar3))
        {
          g_help_flag = 1;
        }
      }
    }
    iVar1 = local_34;
    if ((in_stack_ffffffffffffff8c & 0x1000000) != 0) {
      while (in_stack_ffffffffffffff88 = iVar1 + 1, in_stack_ffffffffffffff88 < *in_RDI) {
        *(undefined8 *)(in_RSI + (long)iVar1 * 8) =
             *(undefined8 *)(in_RSI + (long)in_stack_ffffffffffffff88 * 8);
        iVar1 = in_stack_ffffffffffffff88;
      }
      *in_RDI = *in_RDI + -1;
      *(undefined8 *)(in_RSI + (long)*in_RDI * 8) = 0;
      local_34 = local_34 + -1;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  if ((g_help_flag & 1) != 0) {
    PrintColorEncoded(in_stack_ffffffffffffffe0);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  std::string flagfile_value;
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (ParseFlag(arg, "flagfile", &flagfile_value)) {
      GTEST_FLAG_SET(flagfile, flagfile_value);
      LoadFlagsFromFile(flagfile_value);
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (arg_string == "--help" || HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.
      for (int j = i + 1; j < *argc; ++j) {
        argv[j - 1] = argv[j];
      }

      // Decrements the argument count.
      (*argc)--;

      // Terminate the array with nullptr.
      argv[*argc] = nullptr;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}